

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O2

void cmime_message_add_attachment(CMimeMessage_T *message,char *attachment)

{
  char *pcVar1;
  CMimePart_T *local_28;
  CMimePart_T *part;
  
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x492,"void cmime_message_add_attachment(CMimeMessage_T *, char *)");
  }
  if (attachment != (char *)0x0) {
    local_28 = cmime_part_new();
    if (0 < message->parts->size) {
      *(undefined2 *)((long)message->parts->tail->data + 0x28) = 0;
    }
    cmime_message_add_generated_boundary(message);
    cmime_part_from_file(&local_28,attachment,message->linebreak);
    pcVar1 = strdup(message->boundary);
    local_28->parent_boundary = pcVar1;
    local_28->last = 1;
    cmime_list_append(message->parts,local_28);
    return;
  }
  __assert_fail("attachment",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x493,"void cmime_message_add_attachment(CMimeMessage_T *, char *)");
}

Assistant:

void cmime_message_add_attachment(CMimeMessage_T *message, char *attachment) {

    assert(message);
    assert(attachment);

    CMimePart_T *part = cmime_part_new();
    CMimeListElem_T *elem = NULL;
    CMimePart_T *prev = NULL;

    /* check if there is a previous part */
    if (message->parts->size >= 1) {
        elem = cmime_list_tail(message->parts);
        prev = cmime_list_data(elem);
        prev->last = 0;
        
    }
    cmime_message_add_generated_boundary(message);
    cmime_part_from_file(&part, attachment,message->linebreak);
    part->parent_boundary = strdup(message->boundary);
    part->last = 1;
    cmime_list_append(message->parts,part);

}